

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_segregated_storage.hpp
# Opt level: O0

void __thiscall
boost::simple_segregated_storage<unsigned_long>::add_block
          (simple_segregated_storage<unsigned_long> *this,void *block,size_type nsz,
          size_type npartition_sz)

{
  void *pvVar1;
  undefined8 *in_RDI;
  void *unaff_retaddr;
  
  pvVar1 = segregate(block,nsz,npartition_sz,unaff_retaddr);
  *in_RDI = pvVar1;
  return;
}

Assistant:

void add_block(void * const block,
        const size_type nsz, const size_type npartition_sz)
    { //! Add block
      //! Segregate this block and merge its free list into the
      //!  free list referred to by "first".
      //! \pre Same as segregate.
      //!  \post !empty()
      BOOST_POOL_VALIDATE_INTERNALS
      first = segregate(block, nsz, npartition_sz, first);
      BOOST_POOL_VALIDATE_INTERNALS
    }